

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_3_3::convertInPlace(char **writePtr,char **readPtr,PixelType type,size_t numPixels)

{
  char *text;
  ulong in_RCX;
  int in_EDX;
  long *in_RSI;
  bytesUintOrFloat tmp_1;
  size_t j_2;
  size_t j_1;
  bytesUintOrFloat tmp;
  size_t j;
  char **in_stack_ffffffffffffff98;
  undefined4 uVar1;
  undefined2 in_stack_ffffffffffffffa4;
  half in_stack_ffffffffffffffa6;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  if (in_EDX == 0) {
    uVar1 = 0;
    for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
      Xdr::write<Imf_3_3::CharPtrIO,char*>
                ((char **)CONCAT26(in_stack_ffffffffffffffa6._h,
                                   CONCAT24(in_stack_ffffffffffffffa4,uVar1)),
                 (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      *in_RSI = *in_RSI + 4;
    }
  }
  else if (in_EDX == 1) {
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      Xdr::write<Imf_3_3::CharPtrIO,char*>(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa6);
      *in_RSI = *in_RSI + 2;
    }
  }
  else {
    if (in_EDX != 2) {
      text = (char *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                ((ArgExc *)
                 CONCAT26(in_stack_ffffffffffffffa6._h,CONCAT24(in_stack_ffffffffffffffa4,in_EDX)),
                 text);
      __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    uVar1 = 2;
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      Xdr::write<Imf_3_3::CharPtrIO,char*>
                ((char **)CONCAT26(in_stack_ffffffffffffffa6._h,
                                   CONCAT24(in_stack_ffffffffffffffa4,uVar1)),
                 (float)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      *in_RSI = *in_RSI + 4;
    }
  }
  return;
}

Assistant:

void
convertInPlace (
    char*& writePtr, const char*& readPtr, PixelType type, size_t numPixels)
{
    switch (type)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (size_t j = 0; j < numPixels; ++j)
            {
                union bytesUintOrFloat tmp;
                tmp.b = *reinterpret_cast<const FBytes*> (readPtr);
                Xdr::write<CharPtrIO> (writePtr, tmp.u);
                readPtr += sizeof (unsigned int);
            }
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (size_t j = 0; j < numPixels; ++j)
            {
                Xdr::write<CharPtrIO> (writePtr, *(const half*) readPtr);
                readPtr += sizeof (half);
            }
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (size_t j = 0; j < numPixels; ++j)
            {
                union bytesUintOrFloat tmp;
                tmp.b = *reinterpret_cast<const FBytes*> (readPtr);
                Xdr::write<CharPtrIO> (writePtr, tmp.f);
                readPtr += sizeof (float);
            }
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}